

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte.cpp
# Opt level: O0

void __thiscall merlin::detail::edge::messageBwd(edge *this)

{
  value_type peVar1;
  edge *peVar2;
  reference ppeVar3;
  size_t sVar4;
  factor local_128;
  undefined1 local_c8 [8];
  variable_set elim;
  edge *e;
  size_t i;
  factor F;
  edge *this_local;
  
  F._88_8_ = this;
  factor::factor((factor *)&i,&this->second->theta);
  for (e = (edge *)0x0;
      peVar2 = (edge *)std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>
                       ::size(&this->second->edges), e < peVar2;
      e = (edge *)((long)&(e->sepset).m_v.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start + 1)) {
    ppeVar3 = std::vector<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>::
              operator[](&this->second->edges,(size_type)e);
    peVar1 = *ppeVar3;
    if (peVar1 != this) {
      if (peVar1->first->id == this->second->id) {
        factor::operator*=((factor *)&i,&peVar1->bwd);
      }
      else if (peVar1->second->id == this->second->id) {
        factor::operator*=((factor *)&i,&peVar1->fwd);
      }
    }
  }
  variable_set::operator-((variable_set *)local_c8,&this->second->clique,&this->sepset);
  sVar4 = variable_set::size((variable_set *)local_c8);
  if (sVar4 != 0) {
    factor::sum(&local_128,(factor *)&i,(variable_set *)local_c8);
    factor::operator=((factor *)&i,&local_128);
    factor::~factor(&local_128);
  }
  factor::operator=(&this->bwd,(factor *)&i);
  variable_set::~variable_set((variable_set *)local_c8);
  factor::~factor((factor *)&i);
  return;
}

Assistant:

void detail::edge::messageBwd() {

	// collect the original functions
	factor F = second->theta;

	// collect the incoming messages
	for (size_t i = 0; i < second->edges.size(); ++i) {
		detail::edge* e = second->edges[i];
		if (e == this) {
			continue; // skip current edge
		}
		if (e->first->id == second->id) {
			F *= e->bwd; //e->getMessage2();
		} else if (e->second->id == second->id) {
			F *= e->fwd; //e->getMessage1();
		}
	}

	// marginalize the eliminator
	variable_set elim = (second->clique - sepset);
	if (elim.size() > 0) {
		F = F.sum(elim);
	}

	this->bwd = F;
}